

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O3

bool kratos::is_expand_op(ExprOp op)

{
  int iVar1;
  iterator iVar2;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  undefined8 local_28;
  ExprOp local_20;
  ExprOp op_local;
  
  local_20 = op;
  if (is_expand_op(kratos::ExprOp)::ops == '\0') {
    iVar1 = __cxa_guard_acquire(&is_expand_op(kratos::ExprOp)::ops);
    if (iVar1 != 0) {
      local_38 = 0x1c;
      uStack_34 = 0;
      uStack_30 = 0x1d;
      uStack_2c = 0;
      local_28 = 0x1e;
      std::
      _Hashtable<kratos::ExprOp,kratos::ExprOp,std::allocator<kratos::ExprOp>,std::__detail::_Identity,std::equal_to<kratos::ExprOp>,std::hash<kratos::ExprOp>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
      ::_Hashtable<kratos::ExprOp_const*>
                ((_Hashtable<kratos::ExprOp,kratos::ExprOp,std::allocator<kratos::ExprOp>,std::__detail::_Identity,std::equal_to<kratos::ExprOp>,std::hash<kratos::ExprOp>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                  *)&is_expand_op::ops,&local_38,&local_20,0,(byte *)((long)&op_local + 5),
                 (byte *)((long)&op_local + 6),(byte *)((long)&op_local + 7));
      __cxa_atexit(std::
                   unordered_set<kratos::ExprOp,_std::hash<kratos::ExprOp>,_std::equal_to<kratos::ExprOp>,_std::allocator<kratos::ExprOp>_>
                   ::~unordered_set,&is_expand_op::ops,&__dso_handle);
      __cxa_guard_release(&is_expand_op(kratos::ExprOp)::ops);
    }
  }
  iVar2 = std::
          _Hashtable<kratos::ExprOp,_kratos::ExprOp,_std::allocator<kratos::ExprOp>,_std::__detail::_Identity,_std::equal_to<kratos::ExprOp>,_std::hash<kratos::ExprOp>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&is_expand_op::ops._M_h,&local_20);
  return iVar2.super__Node_iterator_base<kratos::ExprOp,_false>._M_cur != (__node_type *)0x0;
}

Assistant:

bool is_expand_op(ExprOp op) {
    static std::unordered_set<ExprOp> ops = {ExprOp::Concat, ExprOp::Extend, ExprOp::Duplicate};
    return ops.find(op) != ops.end();
}